

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser_traits.h
# Opt level: O2

StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> __thiscall
google::protobuf::json_internal::UnparseProto3Type::GetMessage
          (UnparseProto3Type *this,Field f,Msg *msg,size_t idx)

{
  reference pUVar1;
  anon_union_8_2_a3c22f61_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_3
  extraout_RDX;
  StatusOr<const_google::protobuf::json_internal::UntypedMessage_*> SVar2;
  Span<const_google::protobuf::json_internal::UntypedMessage> local_20;
  
  local_20 = UntypedMessage::Get<google::protobuf::json_internal::UntypedMessage>
                       (msg,(f->raw_->field_0)._impl_.number_);
  pUVar1 = absl::lts_20240722::Span<const_google::protobuf::json_internal::UntypedMessage>::
           operator[](&local_20,idx);
  *(reference *)(this + 8) = pUVar1;
  *(undefined8 *)this = 1;
  SVar2.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.field_1.data_ =
       extraout_RDX.data_;
  SVar2.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>.field_0 =
       (anon_union_8_1_1246618d_for_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>_1
        )this;
  return (StatusOr<const_google::protobuf::json_internal::UntypedMessage_*>)
         SVar2.super_StatusOrData<const_google::protobuf::json_internal::UntypedMessage_*>;
}

Assistant:

static absl::StatusOr<const Msg*> GetMessage(Field f, const Msg& msg,
                                               size_t idx = 0) {
    return &msg.Get<Msg>(f->proto().number())[idx];
  }